

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::assignBufferToVAO
          (GLShaderProgram *this,GLShaderAttribute *a)

{
  element_type *this_00;
  invalid_argument *this_01;
  socklen_t in_ECX;
  sockaddr *__addr;
  int __fd;
  long in_RSI;
  int iArrInd;
  bool in_stack_00000077;
  int local_14;
  long lVar1;
  
  lVar1 = in_RSI;
  bindVAO((GLShaderProgram *)0x4ebb18);
  __fd = (int)lVar1;
  this_00 = std::
            __shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ebb26);
  GLAttributeBuffer::bind(this_00,__fd,__addr,in_ECX);
  checkGLError(in_stack_00000077);
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 0x24); local_14 = local_14 + 1) {
    (*glad_glEnableVertexAttribArray)(*(int *)(in_RSI + 0x28) + local_14);
    switch(*(undefined4 *)(in_RSI + 0x20)) {
    case 0:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,2,0x1406,'\0',*(int *)(in_RSI + 0x24) << 3,
                 (void *)((long)local_14 << 3));
      break;
    case 1:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,3,0x1406,'\0',*(int *)(in_RSI + 0x24) * 0xc,
                 (void *)((long)local_14 * 0xc));
      break;
    case 2:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,4,0x1406,'\0',*(int *)(in_RSI + 0x24) << 4,
                 (void *)((long)local_14 << 4));
      break;
    default:
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_01,"Unrecognized GLShaderAttribute type");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    case 4:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,1,0x1406,'\0',*(int *)(in_RSI + 0x24) << 2,
                 (void *)((long)local_14 << 2));
      break;
    case 5:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,1,0x1404,'\0',*(int *)(in_RSI + 0x24) << 2,
                 (void *)((long)local_14 << 2));
      break;
    case 6:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,1,0x1405,'\0',*(int *)(in_RSI + 0x24) << 2,
                 (void *)((long)local_14 << 2));
      break;
    case 7:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,2,0x1405,'\0',*(int *)(in_RSI + 0x24) << 3,
                 (void *)((long)local_14 << 3));
      break;
    case 8:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,3,0x1405,'\0',*(int *)(in_RSI + 0x24) * 0xc,
                 (void *)((long)local_14 * 0xc));
      break;
    case 9:
      (*glad_glVertexAttribPointer)
                (*(int *)(in_RSI + 0x28) + local_14,4,0x1405,'\0',*(int *)(in_RSI + 0x24) << 4,
                 (void *)((long)local_14 << 4));
    }
  }
  checkGLError(in_stack_00000077);
  return;
}

Assistant:

void GLShaderProgram::assignBufferToVAO(GLShaderAttribute& a) {
  bindVAO();
  a.buff->bind();
  checkGLError();

  // Choose the correct type for the buffer
  for (int iArrInd = 0; iArrInd < a.arrayCount; iArrInd++) {

    glEnableVertexAttribArray(a.location + iArrInd);

    switch (a.type) {
    case RenderDataType::Float:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_FLOAT, GL_FALSE, sizeof(float) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 1 * iArrInd));
      break;
    case RenderDataType::Int:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_INT, GL_FALSE, sizeof(int) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(int) * 1 * iArrInd));
      break;
    case RenderDataType::UInt:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 1 * iArrInd));
      break;
    case RenderDataType::Vector2Float:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_FLOAT, GL_FALSE, sizeof(float) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3Float:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4Float:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_FLOAT, GL_FALSE, sizeof(float) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 4 * iArrInd));
      break;
    case RenderDataType::Vector2UInt:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3UInt:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4UInt:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 4 * iArrInd));
      break;
    default:
      throw std::invalid_argument("Unrecognized GLShaderAttribute type");
      break;
    }
  }

  checkGLError();
}